

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

int Wlc_PrsIsChar(char *pStr)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = *pStr;
  uVar2 = 1;
  if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) && (bVar1 != 0x24)) &&
     (bVar1 != 0x5f)) {
    uVar2 = (uint)(bVar1 == 0x5c);
  }
  return uVar2;
}

Assistant:

static inline int Wlc_PrsIsChar( char * pStr )
{
    return (pStr[0] >= 'a' && pStr[0] <= 'z') || 
           (pStr[0] >= 'A' && pStr[0] <= 'Z') || 
           (pStr[0] >= '0' && pStr[0] <= '9') || 
            pStr[0] == '_' || pStr[0] == '$' || pStr[0] == '\\';
}